

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void __thiscall GLSectorStackPortal::DrawContents(GLSectorStackPortal *this)

{
  FPortal *pFVar1;
  double dVar2;
  FGLRenderer *this_00;
  subsector_t *psVar3;
  long lVar4;
  double dVar5;
  DAngle local_30;
  DVector2 local_28;
  
  this_00 = GLRenderer;
  pFVar1 = this->origin;
  dVar2 = ViewPos.X + (pFVar1->mDisplacement).X;
  dVar5 = ViewPos.Y + (pFVar1->mDisplacement).Y;
  ViewPos.X = dVar2;
  ViewPos.Y = dVar5;
  GLRenderer->mViewActor = (AActor *)0x0;
  if ((long)pFVar1->plane != -1) {
    GLPortal::instack[pFVar1->plane] = GLPortal::instack[pFVar1->plane] + 1;
  }
  local_30.Degrees = ViewAngle.Degrees;
  FGLRenderer::SetupView
            (this_00,(float)dVar2,(float)dVar5,(float)ViewPos.Z,&local_30,
             (bool)((byte)GLPortal::MirrorFlag & 1),(bool)((byte)GLPortal::PlaneMirrorFlag & 1));
  GLPortal::SaveMapSection(&this->super_GLPortal);
  SetupCoverage(this);
  GLPortal::ClearClipper(&this->super_GLPortal);
  local_28.X = ViewPos.X;
  local_28.Y = ViewPos.Y;
  psVar3 = R_PointInSubsector(&local_28);
  if (((gl_drawinfo->ss_renderflags).Array[((long)psVar3 - (long)subsectors) / 0x60] & 0x10) == 0) {
    Clipper::AddClipRange(&clipper,0,0xffffffff);
    clipper.blocked = true;
  }
  FGLRenderer::DrawScene(GLRenderer,2);
  memcpy(currentmapsection.Array,(this->super_GLPortal).savedmapsection.Array,
         (ulong)currentmapsection.Count);
  lVar4 = (long)this->origin->plane;
  if (lVar4 != -1) {
    GLPortal::instack[lVar4] = GLPortal::instack[lVar4] + -1;
  }
  return;
}

Assistant:

void GLSectorStackPortal::DrawContents()
{
	FPortal *portal = origin;

	ViewPos += origin->mDisplacement;
	GLRenderer->mViewActor = NULL;

	// avoid recursions!
	if (origin->plane != -1) instack[origin->plane]++;

	GLRenderer->SetupView(ViewPos.X, ViewPos.Y, ViewPos.Z, ViewAngle, !!(MirrorFlag&1), !!(PlaneMirrorFlag&1));
	SaveMapSection();
	SetupCoverage();
	ClearClipper();
	
	// If the viewpoint is not within the portal, we need to invalidate the entire clip area.
	// The portal will re-validate the necessary parts when its subsectors get traversed.
	subsector_t *sub = R_PointInSubsector(ViewPos);
	if (!(gl_drawinfo->ss_renderflags[sub - ::subsectors] & SSRF_SEEN))
	{
		clipper.SafeAddClipRange(0, ANGLE_MAX);
		clipper.SetBlocked(true);
	}

	GLRenderer->DrawScene(DM_PORTAL);
	RestoreMapSection();

	if (origin->plane != -1) instack[origin->plane]--;
}